

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O2

int nghttp2_frame_unpack_origin_payload
              (nghttp2_extension *frame,uint8_t *payload,size_t payloadlen,nghttp2_mem *mem)

{
  long *plVar1;
  uint16_t uVar2;
  ulong uVar3;
  undefined8 *puVar4;
  ulong uVar5;
  long lVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  long local_40;
  
  plVar1 = (long *)frame->payload;
  puVar8 = payload + payloadlen;
  local_40 = 0;
  lVar6 = 0;
  puVar7 = payload;
  do {
    uVar5 = (long)puVar8 - (long)puVar7;
    do {
      if (puVar7 == puVar8) {
        if (local_40 == 0) {
          *plVar1 = 0;
          plVar1[1] = 0;
        }
        else {
          puVar4 = (undefined8 *)nghttp2_mem_malloc(mem,lVar6 + local_40 * 0x10);
          if (puVar4 == (undefined8 *)0x0) {
            return -0x385;
          }
          plVar1[1] = (long)puVar4;
          *plVar1 = local_40;
          puVar7 = (uint8_t *)(puVar4 + local_40 * 2);
          while (payload != puVar8) {
            uVar2 = nghttp2_get_uint16(payload);
            payload = payload + 2;
            if (uVar2 != 0) {
              uVar5 = (ulong)uVar2;
              *puVar4 = puVar7;
              puVar4[1] = uVar5;
              puVar7 = nghttp2_cpymem(puVar7,payload,uVar5);
              *puVar7 = '\0';
              puVar7 = puVar7 + 1;
              payload = payload + uVar5;
              puVar4 = puVar4 + 2;
            }
          }
        }
        return 0;
      }
      if ((long)uVar5 < 2) {
        return -0x20a;
      }
      uVar2 = nghttp2_get_uint16(puVar7);
      puVar7 = puVar7 + 2;
      uVar5 = uVar5 - 2;
    } while (uVar2 == 0);
    uVar3 = (ulong)uVar2;
    if (uVar5 < uVar3) {
      return -0x20a;
    }
    puVar7 = puVar7 + uVar3;
    lVar6 = lVar6 + uVar3 + 1;
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

int nghttp2_frame_unpack_origin_payload(nghttp2_extension *frame,
                                        const uint8_t *payload,
                                        size_t payloadlen, nghttp2_mem *mem) {
  nghttp2_ext_origin *origin;
  const uint8_t *p, *end;
  uint8_t *dst;
  size_t originlen;
  nghttp2_origin_entry *ov;
  size_t nov = 0;
  size_t len = 0;

  origin = frame->payload;
  p = end = payload;
  if (payloadlen) {
    end += payloadlen;
  }

  for (; p != end;) {
    if (end - p < 2) {
      return NGHTTP2_ERR_FRAME_SIZE_ERROR;
    }
    originlen = nghttp2_get_uint16(p);
    p += 2;
    if (originlen == 0) {
      continue;
    }
    if (originlen > (size_t)(end - p)) {
      return NGHTTP2_ERR_FRAME_SIZE_ERROR;
    }
    p += originlen;
    /* 1 for terminal NULL */
    len += originlen + 1;
    ++nov;
  }

  if (nov == 0) {
    origin->ov = NULL;
    origin->nov = 0;

    return 0;
  }

  len += nov * sizeof(nghttp2_origin_entry);

  ov = nghttp2_mem_malloc(mem, len);
  if (ov == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  origin->ov = ov;
  origin->nov = nov;

  dst = (uint8_t *)ov + nov * sizeof(nghttp2_origin_entry);
  p = payload;

  for (; p != end;) {
    originlen = nghttp2_get_uint16(p);
    p += 2;
    if (originlen == 0) {
      continue;
    }
    ov->origin = dst;
    ov->origin_len = originlen;
    dst = nghttp2_cpymem(dst, p, originlen);
    *dst++ = '\0';
    p += originlen;
    ++ov;
  }

  return 0;
}